

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::TextureGatherCubeInstance::TextureGatherCubeInstance
          (TextureGatherCubeInstance *this,Context *context,GatherCaseBaseParams *baseParams,
          int textureSize,
          vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
          *iterations)

{
  TextureFormat *format;
  TextureFormat local_44 [2];
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  *local_30;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  *iterations_local;
  GatherCaseBaseParams *pGStack_20;
  int textureSize_local;
  GatherCaseBaseParams *baseParams_local;
  Context *context_local;
  TextureGatherCubeInstance *this_local;
  
  local_30 = iterations;
  iterations_local._4_4_ = textureSize;
  pGStack_20 = baseParams;
  baseParams_local = (GatherCaseBaseParams *)context;
  context_local = (Context *)this;
  TextureGatherInstance::TextureGatherInstance
            (&this->super_TextureGatherInstance,context,baseParams);
  (this->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__TextureGatherCubeInstance_016a9928;
  *(int *)&(this->super_TextureGatherInstance).field_0x264 = iterations_local._4_4_;
  std::
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  ::vector(&this->m_iterations,local_30);
  tcu::TextureFormat::TextureFormat(local_44);
  format = local_44;
  tcu::TextureCube::TextureCube(&this->m_swizzledTexture,format,1);
  TextureGatherInstance::init(&this->super_TextureGatherInstance,(EVP_PKEY_CTX *)format);
  return;
}

Assistant:

TextureGatherCubeInstance::TextureGatherCubeInstance (Context&							context,
													  const GatherCaseBaseParams&		baseParams,
													  const int							textureSize,
													  const vector<GatherCubeArgs>&		iterations)
	: TextureGatherInstance		(context, baseParams)
	, m_textureSize				(textureSize)
	, m_iterations				(iterations)
	, m_swizzledTexture			(tcu::TextureFormat(), 1)
{
	init();
}